

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_quotient(sexp ctx,sexp a,sexp b)

{
  undefined1 auVar1 [16];
  sexp *ppsVar2;
  sexp *ppsVar3;
  sexp *ppsVar4;
  uint uVar5;
  sexp psVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp rem;
  sexp local_68;
  double local_60;
  sexp_gc_var_t local_58;
  sexp_conflict local_40;
  sexp_gc_var_t local_38;
  
  local_58.var = &local_68;
  if (((ulong)a & 3) == 0) {
    uVar5 = 0;
    if ((ulong)a->tag < 0x11) {
      uVar5 = sexp_number_types[a->tag];
    }
  }
  else {
    uVar5 = (uint)a & 1;
  }
  if (((ulong)b & 3) == 0) {
    uVar8 = 0;
    if ((ulong)b->tag < 0x11) {
      uVar8 = sexp_number_types[b->tag];
    }
  }
  else {
    uVar8 = (uint)b & 1;
  }
  local_68 = (sexp)&DAT_0000043e;
  if (b == (sexp)&DAT_00000003) {
    return a;
  }
  local_58.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_58;
  psVar6 = (sexp)&DAT_0000043e;
  ppsVar2 = &local_68;
  ppsVar3 = &local_68;
  ppsVar4 = &local_68;
  switch(uVar8 + uVar5 * 6) {
  case 6:
  case 10:
  case 0xb:
  case 0xc:
  case 0x12:
  case 0x16:
  case 0x17:
    goto switchD_0011beac_caseD_6;
  case 7:
    auVar1._8_8_ = (long)a >> 0x3f;
    auVar1._0_8_ = (long)a >> 1;
    uVar7 = SUB168(auVar1 / SEXT816((long)b >> 1),0);
    if ((long)((ulong)a & (ulong)b & uVar7) < 0) {
      local_58.var = &local_68;
      local_68 = sexp_fixnum_to_bignum(ctx,a);
      psVar6 = sexp_quotient(ctx,local_68,b);
    }
    else {
      psVar6 = (sexp)(uVar7 * 2 + 1);
    }
    break;
  case 8:
  case 0x14:
  case 0x1a:
    local_60 = (b->value).flonum;
    local_58.var = &local_68;
    dVar9 = trunc(local_60);
    ppsVar2 = local_58.var;
    if ((local_60 == dVar9) && (!NAN(local_60) && !NAN(dVar9))) {
      psVar6 = sexp_double_to_bignum(ctx,local_60);
      b = sexp_bignum_normalize(psVar6);
      local_68 = b;
LAB_0011bf6f:
      local_68 = sexp_quotient(ctx,a,b);
      psVar6 = sexp_to_inexact(ctx,local_68);
      break;
    }
    goto switchD_0011beac_caseD_6;
  case 9:
    psVar6 = (sexp)&DAT_00000001;
    break;
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    local_60 = (a->value).flonum;
    local_58.var = &local_68;
    dVar9 = trunc(local_60);
    ppsVar3 = local_58.var;
    if ((local_60 == dVar9) && (!NAN(local_60) && !NAN(dVar9))) {
      psVar6 = sexp_double_to_bignum(ctx,local_60);
      a = sexp_bignum_normalize(psVar6);
      local_68 = a;
      goto LAB_0011bf6f;
    }
  case 0:
  case 1:
  case 2:
  case 3:
  case 0x11:
  case 0x19:
  case 0x1b:
  case 0x1c:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
    local_58.var = ppsVar3;
LAB_0011bf2b:
    psVar6 = sexp_type_exception(ctx,(sexp)0x0,2,a);
    break;
  case 0x13:
    b = sexp_fixnum_to_bignum(ctx,b);
    local_68 = b;
    ppsVar4 = local_58.var;
  case 0x15:
    local_58.var = ppsVar4;
    local_38.var = &local_40;
    local_40 = (sexp_conflict)&DAT_0000043e;
    local_38.next = (ctx->value).context.saves;
    (ctx->value).context.saves = &local_38;
    psVar6 = sexp_bignum_quot_rem(ctx,local_38.var,a,b);
    (ctx->value).context.saves = local_38.next;
    psVar6 = sexp_bignum_normalize(psVar6);
  }
  (ctx->value).context.saves = local_58.next;
  return psVar6;
switchD_0011beac_caseD_6:
  local_58.var = ppsVar2;
  a = b;
  goto LAB_0011bf2b;
}

Assistant:

sexp sexp_quotient (sexp ctx, sexp a, sexp b) {
  int at=sexp_number_type(a), bt=sexp_number_type(b);
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  if (b == SEXP_ONE) return a;
  sexp_gc_preserve1(ctx, tmp);
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, a);
    break;
  case SEXP_NUM_FIX_NOT: case SEXP_NUM_FLO_NOT: case SEXP_NUM_BIG_NOT:
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, b);
    break;
  case SEXP_NUM_FLO_FIX: case SEXP_NUM_FLO_FLO: case SEXP_NUM_FLO_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
#endif
    if (sexp_flonum_value(a) != trunc(sexp_flonum_value(a))) {
      r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, a);
    } else {
      tmp = sexp_bignum_normalize(sexp_double_to_bignum(ctx, sexp_flonum_value(a)));
      tmp = sexp_quotient(ctx, tmp, b);
      r = sexp_to_inexact(ctx, tmp);
    }
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_FIX: case SEXP_NUM_RAT_BIG: case SEXP_NUM_RAT_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_FLO_CPX: case SEXP_NUM_CPX_FIX: case SEXP_NUM_CPX_FLO:
  case SEXP_NUM_CPX_BIG: case SEXP_NUM_CPX_CPX:
#if SEXP_USE_RATIOS
  case SEXP_NUM_CPX_RAT:
#endif
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, a);
    break;
  case SEXP_NUM_FIX_FLO: case SEXP_NUM_BIG_FLO:
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_FLO:
#endif
    if (sexp_flonum_value(b) != trunc(sexp_flonum_value(b))) {
      r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, b);
    } else {
      tmp = sexp_bignum_normalize(sexp_double_to_bignum(ctx, sexp_flonum_value(b)));
      tmp = sexp_quotient(ctx, a, tmp);
      r = sexp_to_inexact(ctx, tmp);
    }
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FIX_RAT: case SEXP_NUM_BIG_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_FIX_CPX: case SEXP_NUM_BIG_CPX:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_FIXNUM, b);
    break;
  case SEXP_NUM_FIX_FIX:
    r = sexp_fx_div(a, b);
    if ((sexp_sint_t)a < 0 && (sexp_sint_t)b < 0 && (sexp_sint_t)r < 0) {
      r = sexp_quotient(ctx, tmp=sexp_fixnum_to_bignum(ctx, a), b);
    }
    break;
  case SEXP_NUM_FIX_BIG:
    r = SEXP_ZERO;
    break;
  case SEXP_NUM_BIG_FIX:
    b = tmp = sexp_fixnum_to_bignum(ctx, b);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_quotient(ctx, a, b));
    break;
  }
  sexp_gc_release1(ctx);
  return r;
}